

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSampleValue(AsciiParser *this,uint32_t type_id,Value *result)

{
  bool bVar1;
  ostream *poVar2;
  uint32_t tyid;
  uint32_t tyid_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  uint32_t extraout_EDX_09;
  uint32_t extraout_EDX_10;
  uint32_t extraout_EDX_11;
  uint32_t extraout_EDX_12;
  uint32_t extraout_EDX_13;
  uint32_t extraout_EDX_14;
  uint32_t extraout_EDX_15;
  uint32_t extraout_EDX_16;
  uint32_t extraout_EDX_17;
  uint32_t extraout_EDX_18;
  uint32_t extraout_EDX_19;
  uint32_t uVar3;
  uint32_t extraout_EDX_20;
  uint32_t extraout_EDX_21;
  uint32_t extraout_EDX_22;
  uint32_t extraout_EDX_23;
  uint32_t extraout_EDX_24;
  uint32_t extraout_EDX_25;
  uint32_t extraout_EDX_26;
  uint32_t extraout_EDX_27;
  uint32_t extraout_EDX_28;
  uint32_t extraout_EDX_29;
  uint32_t extraout_EDX_30;
  uint32_t extraout_EDX_31;
  uint32_t extraout_EDX_32;
  uint32_t extraout_EDX_33;
  uint32_t extraout_EDX_34;
  uint32_t extraout_EDX_35;
  uint32_t extraout_EDX_36;
  uint32_t extraout_EDX_37;
  string *msg;
  value *pvStack_2b0;
  texcoord3f typed_val_1;
  storage_union local_280;
  undefined **local_270;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  token typed_val;
  ostringstream ss_e;
  undefined6 uStack_1a6;
  float fStack_1a4;
  vtable_type *local_198;
  
  if (result == (Value *)0x0) {
    return false;
  }
  bVar1 = MaybeNone(this);
  if (bVar1) {
    linb::any::operator=(&result->v_,(ValueBlock *)&ss_e);
    return true;
  }
  local_270 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_280.dynamic = (void *)0x0;
  switch(type_id) {
  case 6:
    typed_val.str_._M_dataplus._M_p = (pointer)&typed_val.str_.field_2;
    typed_val.str_._M_string_length._0_4_ = 0;
    typed_val.str_._M_string_length._4_4_ = 0;
    typed_val.str_.field_2._M_allocated_capacity._0_4_ =
         typed_val.str_.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    bVar1 = ReadBasicType(this,&typed_val);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6d);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x6;
      uVar3 = extraout_EDX_18;
      goto LAB_002d2d13;
    }
    linb::any::construct<tinyusdz::Token_const&>((any *)&ss_e,&typed_val);
LAB_002d1d0b:
    linb::any::operator=((any *)&local_280,(any *)&ss_e);
    if (local_198 != (vtable_type *)0x0) {
      (*local_198->destroy)((storage_union *)&ss_e);
    }
    goto LAB_002d2db6;
  case 7:
    typed_val.str_._M_dataplus._M_p = (pointer)&typed_val.str_.field_2;
    typed_val.str_._M_string_length._0_4_ = 0;
    typed_val.str_._M_string_length._4_4_ = 0;
    typed_val.str_.field_2._M_allocated_capacity._0_4_ =
         (uint)(uint3)typed_val.str_.field_2._M_allocated_capacity._1_3_ << 8;
    bVar1 = ReadBasicType(this,&typed_val.str_);
    if (bVar1) {
      linb::any::construct<std::__cxx11::string_const&>((any *)&ss_e,&typed_val.str_);
      goto LAB_002d1d0b;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6e);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x7;
    uVar3 = extraout_EDX_19;
LAB_002d2d13:
    tinyusdz::value::GetTypeName_abi_cxx11_((string *)&typed_val_1,pvStack_2b0,uVar3);
    ::std::operator+(&local_248,"Failed to parse value with requested type `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &typed_val_1);
    ::std::operator+(&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_248
                     ,"`");
    poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_268);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_268);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_002d2db6:
    ::std::__cxx11::string::_M_dispose();
LAB_002d2dc3:
    if (bVar1 != false) goto LAB_002d206c;
    goto LAB_002d37f7;
  default:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x95);
    ::std::operator<<(poVar2," ");
    tinyusdz::value::GetTypeName_abi_cxx11_(&local_268,(value *)(ulong)type_id,tyid);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&typed_val
                     ," : TODO: timeSamples type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_268
                    );
    poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&typed_val);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    goto LAB_002d37bf;
  case 0xe:
    bVar1 = ReadBasicType(this,(half *)&typed_val_1);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x77);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0xe;
      uVar3 = extraout_EDX_12;
      break;
    }
    local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::half>()::table;
    _ss_e = typed_val_1.s._0_2_;
    goto LAB_002d204b;
  case 0xf:
    bVar1 = ReadBasicType(this,(int *)&typed_val_1);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x70);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0xf;
      uVar3 = extraout_EDX_25;
      break;
    }
    local_198 = (vtable_type *)linb::any::vtable_for_type<int>()::table;
LAB_002d1e04:
    _ss_e = typed_val_1.s;
    goto LAB_002d204b;
  case 0x10:
    bVar1 = ReadBasicType(this,(int64_t *)&typed_val_1);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x75);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x10;
      uVar3 = extraout_EDX_26;
      break;
    }
    local_198 = (vtable_type *)linb::any::vtable_for_type<long>()::table;
LAB_002d1e8b:
    _ss_e = typed_val_1._0_8_;
    goto LAB_002d204b;
  case 0x11:
    bVar1 = ReadBasicType(this,(half2 *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)
                  linb::any::vtable_for_type<std::array<tinyusdz::value::half,2ul>>()::table;
      goto LAB_002d1e04;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x78);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x11;
    uVar3 = extraout_EDX_15;
    break;
  case 0x12:
    bVar1 = ReadBasicType(this,(half3 *)&typed_val_1);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x79);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x12;
      uVar3 = extraout_EDX_20;
      break;
    }
    local_198 = (vtable_type *)
                linb::any::vtable_for_type<std::array<tinyusdz::value::half,3ul>>()::table;
    _ss_e = typed_val_1._0_6_;
    goto LAB_002d204b;
  case 0x13:
    bVar1 = ReadBasicType(this,(half4 *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)
                  linb::any::vtable_for_type<std::array<tinyusdz::value::half,4ul>>()::table;
      goto LAB_002d1e8b;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7a);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x13;
    uVar3 = extraout_EDX_21;
    break;
  case 0x14:
    bVar1 = ReadBasicType(this,(int2 *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<int,2ul>>()::table;
      goto LAB_002d1e8b;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x71);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x14;
    uVar3 = extraout_EDX_29;
    break;
  case 0x15:
    bVar1 = ReadBasicType(this,(int3 *)&typed_val_1);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x72);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x15;
      uVar3 = extraout_EDX_28;
      break;
    }
    local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<int,3ul>>()::table;
LAB_002d2002:
    _ss_e = typed_val_1._0_8_;
    goto LAB_002d204b;
  case 0x16:
    bVar1 = ReadBasicType(this,(int4 *)&typed_val_1);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x73);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x16;
      uVar3 = extraout_EDX_06;
      break;
    }
    local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<int,4ul>>()::table;
LAB_002d2038:
LAB_002d2048:
    fStack_1a4 = typed_val_1.t;
    _ss_e = typed_val_1.s;
    goto LAB_002d204b;
  case 0x1b:
    bVar1 = ReadBasicType(this,(uint32_t *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<unsigned_int>()::table;
      goto LAB_002d1e04;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x74);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x1b;
    uVar3 = extraout_EDX_16;
    break;
  case 0x1c:
    bVar1 = ReadBasicType(this,(uint64_t *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<unsigned_long>()::table;
      goto LAB_002d1e8b;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x76);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x1c;
    uVar3 = extraout_EDX_10;
    break;
  case 0x28:
    bVar1 = ReadBasicType(this,&typed_val_1.s);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6f);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x28;
      uVar3 = extraout_EDX_03;
      break;
    }
    local_198 = (vtable_type *)linb::any::vtable_for_type<float>()::table;
    _ss_e = typed_val_1.s;
    goto LAB_002d204b;
  case 0x29:
    bVar1 = ReadBasicType(this,(float2 *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<float,2ul>>()::table;
      goto LAB_002d1e8b;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7c);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x29;
    uVar3 = extraout_EDX_22;
    break;
  case 0x2a:
    bVar1 = ReadBasicType(this,(float3 *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<float,3ul>>()::table;
      goto LAB_002d2002;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7d);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x2a;
    uVar3 = extraout_EDX_23;
    break;
  case 0x2b:
    bVar1 = ReadBasicType(this,(float4 *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<float,4ul>>()::table;
      goto LAB_002d2038;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7e);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x2b;
    uVar3 = extraout_EDX_32;
    break;
  case 0x2c:
    bVar1 = ReadBasicType(this,(double *)&typed_val_1);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7f);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x2c;
      uVar3 = extraout_EDX_30;
      break;
    }
    local_198 = (vtable_type *)linb::any::vtable_for_type<double>()::table;
    _ss_e = typed_val_1._0_8_;
    goto LAB_002d204b;
  case 0x2d:
    bVar1 = ReadBasicType(this,(double2 *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<double,2ul>>()::table;
      goto LAB_002d2038;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x80);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x2d;
    uVar3 = extraout_EDX_01;
    break;
  case 0x2e:
    bVar1 = ReadBasicType(this,(double3 *)&typed_val_1);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x81);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x2e;
      uVar3 = extraout_EDX_11;
      break;
    }
    linb::any::construct<std::array<double,3ul>const&>
              ((any *)&ss_e,(array<double,_3UL> *)&typed_val_1);
    goto LAB_002d204b;
  case 0x2f:
    bVar1 = ReadBasicType(this,(double4 *)&typed_val);
    if (bVar1) {
      linb::any::construct<std::array<double,4ul>const&>
                ((any *)&ss_e,(array<double,_4UL> *)&typed_val);
      goto LAB_002d204b;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x82);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x2f;
    uVar3 = extraout_EDX_33;
LAB_002d35df:
    tinyusdz::value::GetTypeName_abi_cxx11_((string *)&typed_val_1,pvStack_2b0,uVar3);
    ::std::operator+(&local_248,"Failed to parse value with requested type `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &typed_val_1);
    ::std::operator+(&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_248
                     ,"`");
    poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_268);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    msg = &local_268;
    goto LAB_002d37d4;
  case 0x30:
    bVar1 = ReadBasicType(this,(quath *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::quath>()::table;
      goto LAB_002d1e8b;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x83);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x30;
    uVar3 = extraout_EDX_02;
    break;
  case 0x31:
    bVar1 = ReadBasicType(this,(quatf *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::quatf>()::table;
      goto LAB_002d2038;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x84);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x31;
    uVar3 = extraout_EDX_09;
    break;
  case 0x32:
    bVar1 = ReadBasicType(this,(quatd *)&typed_val);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x85);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x32;
      uVar3 = extraout_EDX_05;
      goto LAB_002d35df;
    }
    linb::any::construct<tinyusdz::value::quatd_const&>((any *)&ss_e,(quatd *)&typed_val);
    goto LAB_002d204b;
  case 0x33:
    typed_val_1.s = 1.0;
    typed_val_1.t = 0.0;
    stack0xfffffffffffffd60 = 0.0078125;
    bVar1 = ReadBasicType(this,(matrix2f *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::matrix2f>()::table;
      goto LAB_002d2048;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x8f);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x33;
    uVar3 = extraout_EDX_17;
    break;
  case 0x34:
    typed_val.str_._M_dataplus._M_p._0_4_ = 0x3f800000;
    typed_val.str_._M_dataplus._M_p._4_4_ = 0;
    typed_val.str_._M_string_length._0_4_ = 0;
    typed_val.str_._M_string_length._4_4_ = 0;
    typed_val.str_.field_2._M_allocated_capacity._0_4_ = 0x3f800000;
    typed_val.str_.field_2._M_allocated_capacity._4_4_ = 0;
    typed_val.str_.field_2._8_8_ = 0;
    bVar1 = ReadBasicType(this,(matrix3f *)&typed_val);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x90);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x34;
      uVar3 = extraout_EDX_04;
      goto LAB_002d35df;
    }
    linb::any::construct<tinyusdz::value::matrix3f_const&>((any *)&ss_e,(matrix3f *)&typed_val);
    goto LAB_002d204b;
  case 0x35:
    typed_val.str_._M_dataplus._M_p._0_4_ = 0x3f800000;
    typed_val.str_._M_dataplus._M_p._4_4_ = 0;
    typed_val.str_._M_string_length._0_4_ = 0;
    typed_val.str_._M_string_length._4_4_ = 0;
    typed_val.str_.field_2._M_allocated_capacity._0_4_ = 0;
    typed_val.str_.field_2._M_allocated_capacity._4_4_ = 0x3f800000;
    typed_val.str_.field_2._8_8_ = 0;
    bVar1 = ReadBasicType(this,(matrix4f *)&typed_val);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x91);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x35;
      uVar3 = extraout_EDX_35;
      goto LAB_002d35df;
    }
    linb::any::construct<tinyusdz::value::matrix4f_const&>((any *)&ss_e,(matrix4f *)&typed_val);
    goto LAB_002d204b;
  case 0x36:
    typed_val.str_._M_dataplus._M_p._0_4_ = 0;
    typed_val.str_._M_dataplus._M_p._4_4_ = 0x3ff00000;
    typed_val.str_._M_string_length._0_4_ = 0;
    typed_val.str_._M_string_length._4_4_ = 0;
    typed_val.str_.field_2._M_allocated_capacity._0_4_ = 0;
    typed_val.str_.field_2._M_allocated_capacity._4_4_ = 0;
    typed_val.str_.field_2._8_8_ = 0x3ff0000000000000;
    bVar1 = ReadBasicType(this,(matrix2d *)&typed_val);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x92);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x36;
      uVar3 = extraout_EDX_34;
      goto LAB_002d35df;
    }
    linb::any::construct<tinyusdz::value::matrix2d_const&>((any *)&ss_e,(matrix2d *)&typed_val);
    goto LAB_002d204b;
  case 0x37:
    typed_val.str_._M_dataplus._M_p._0_4_ = 0;
    typed_val.str_._M_dataplus._M_p._4_4_ = 0x3ff00000;
    typed_val.str_.field_2._8_8_ = 0;
    typed_val.str_._M_string_length._0_4_ = 0;
    typed_val.str_._M_string_length._4_4_ = 0;
    typed_val.str_.field_2._M_allocated_capacity._0_4_ = 0;
    typed_val.str_.field_2._M_allocated_capacity._4_4_ = 0;
    bVar1 = ReadBasicType(this,(matrix3d *)&typed_val);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x93);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x37;
      uVar3 = extraout_EDX_08;
      goto LAB_002d35df;
    }
    linb::any::construct<tinyusdz::value::matrix3d_const&>((any *)&ss_e,(matrix3d *)&typed_val);
    goto LAB_002d204b;
  case 0x38:
    typed_val.str_._M_dataplus._M_p._0_4_ = 0;
    typed_val.str_._M_dataplus._M_p._4_4_ = 0x3ff00000;
    typed_val.str_._M_string_length._0_4_ = 0;
    typed_val.str_._M_string_length._4_4_ = 0;
    typed_val.str_.field_2._M_allocated_capacity._0_4_ = 0;
    typed_val.str_.field_2._M_allocated_capacity._4_4_ = 0;
    typed_val.str_.field_2._8_8_ = 0;
    bVar1 = ReadBasicType(this,(matrix4d *)&typed_val);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x94);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x38;
      uVar3 = extraout_EDX_13;
      goto LAB_002d35df;
    }
    linb::any::construct<tinyusdz::value::matrix4d_const&>((any *)&ss_e,(matrix4d *)&typed_val);
    goto LAB_002d204b;
  case 0x3a:
    bVar1 = ReadBasicType(this,(color3f *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::color3f>()::table;
      goto LAB_002d2002;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x86);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x3a;
    uVar3 = extraout_EDX_24;
    break;
  case 0x3b:
    bVar1 = ReadBasicType(this,(color3d *)&typed_val_1);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x88);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x3b;
      uVar3 = extraout_EDX_14;
      break;
    }
    linb::any::construct<tinyusdz::value::color3d_const&>((any *)&ss_e,(color3d *)&typed_val_1);
    goto LAB_002d204b;
  case 0x3d:
    bVar1 = ReadBasicType(this,(color4f *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::color4f>()::table;
      goto LAB_002d2038;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x87);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x3d;
    uVar3 = extraout_EDX_37;
    break;
  case 0x3e:
    bVar1 = ReadBasicType(this,(color4d *)&typed_val);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x89);
      ::std::operator<<(poVar2," ");
      pvStack_2b0 = (value *)0x3e;
      uVar3 = extraout_EDX_07;
      goto LAB_002d35df;
    }
    linb::any::construct<tinyusdz::value::color4d_const&>((any *)&ss_e,(color4d *)&typed_val);
LAB_002d204b:
    linb::any::operator=((any *)&local_280,(any *)&ss_e);
    if (local_198 != (vtable_type *)0x0) {
      (*local_198->destroy)((storage_union *)&ss_e);
    }
LAB_002d206c:
    linb::any::operator=(&result->v_,(any *)&local_280);
    bVar1 = true;
    goto LAB_002d37f9;
  case 0x40:
    bVar1 = ReadBasicType(this,(point3f *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::point3f>()::table;
      goto LAB_002d2002;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x8c);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x40;
    uVar3 = extraout_EDX_31;
    break;
  case 0x43:
    bVar1 = ReadBasicType(this,(normal3f *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::normal3f>()::table;
      goto LAB_002d2002;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x8b);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x43;
    uVar3 = extraout_EDX_36;
    break;
  case 0x46:
    bVar1 = ReadBasicType(this,(vector3f *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::vector3f>()::table;
      goto LAB_002d2002;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x8a);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x46;
    uVar3 = extraout_EDX_00;
    break;
  case 0x4a:
    bVar1 = ReadBasicType(this,(texcoord2f *)&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::texcoord2f>()::table;
      goto LAB_002d1e8b;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x8d);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x4a;
    uVar3 = extraout_EDX_27;
    break;
  case 0x4d:
    bVar1 = ReadBasicType(this,&typed_val_1);
    if (bVar1) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::texcoord3f>()::table;
      goto LAB_002d2002;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x8e);
    ::std::operator<<(poVar2," ");
    pvStack_2b0 = (value *)0x4d;
    uVar3 = extraout_EDX;
    break;
  case 0x51:
    typed_val.str_._M_dataplus._M_p = (pointer)&typed_val.str_.field_2;
    typed_val.str_._M_string_length._0_4_ = 0;
    typed_val.str_._M_string_length._4_4_ = 0;
    typed_val.str_.field_2._M_allocated_capacity._0_4_ =
         (uint)(uint3)typed_val.str_.field_2._M_allocated_capacity._1_3_ << 8;
    bVar1 = ReadBasicType(this,(AssetPath *)&typed_val);
    if (bVar1) {
      linb::any::construct<tinyusdz::value::AssetPath_const&>((any *)&ss_e,(AssetPath *)&typed_val);
      linb::any::operator=((any *)&local_280,(any *)&ss_e);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&ss_e);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6c);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::GetTypeName_abi_cxx11_((string *)&typed_val_1,(value *)0x51,tyid_00);
      ::std::operator+(&local_248,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &typed_val_1);
      ::std::operator+(&local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_248,"`");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_268);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_268);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&typed_val);
    goto LAB_002d2dc3;
  }
  tinyusdz::value::GetTypeName_abi_cxx11_((string *)&local_248,pvStack_2b0,uVar3);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_268,
                   "Failed to parse value with requested type `",&local_248);
  ::std::operator+(&typed_val.str_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_268,
                   "`");
  poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&typed_val.str_);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
LAB_002d37bf:
  ::std::__cxx11::string::_M_dispose();
  msg = &typed_val.str_;
LAB_002d37d4:
  ::std::__cxx11::stringbuf::str();
  PushError(this,msg);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_002d37f7:
  bVar1 = false;
LAB_002d37f9:
  if (local_270 != (undefined **)0x0) {
    (*(code *)local_270[4])(&local_280);
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ParseTimeSampleValue(const uint32_t type_id, value::Value *result) {

  if (!result) {
    return false;
  }

  if (MaybeNone()) {
    (*result) = value::ValueBlock();
    return true;
  }

  value::Value val;

#define PARSE_TYPE(__tyid, __type)                       \
  if (__tyid == value::TypeTraits<__type>::type_id()) {             \
    __type typed_val; \
    if (!ReadBasicType(&typed_val)) {                             \
      PUSH_ERROR_AND_RETURN("Failed to parse value with requested type `" + value::GetTypeName(__tyid) + "`"); \
    }                                                                  \
    val = value::Value(typed_val); \
  } else

  // NOTE: `string` does not support multi-line string.
  PARSE_TYPE(type_id, value::AssetPath)
  PARSE_TYPE(type_id, value::token)
  PARSE_TYPE(type_id, std::string)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, int32_t)
  PARSE_TYPE(type_id, value::int2)
  PARSE_TYPE(type_id, value::int3)
  PARSE_TYPE(type_id, value::int4)
  PARSE_TYPE(type_id, uint32_t)
  PARSE_TYPE(type_id, int64_t)
  PARSE_TYPE(type_id, uint64_t)
  PARSE_TYPE(type_id, value::half)
  PARSE_TYPE(type_id, value::half2)
  PARSE_TYPE(type_id, value::half3)
  PARSE_TYPE(type_id, value::half4)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, value::float2)
  PARSE_TYPE(type_id, value::float3)
  PARSE_TYPE(type_id, value::float4)
  PARSE_TYPE(type_id, double)
  PARSE_TYPE(type_id, value::double2)
  PARSE_TYPE(type_id, value::double3)
  PARSE_TYPE(type_id, value::double4)
  PARSE_TYPE(type_id, value::quath)
  PARSE_TYPE(type_id, value::quatf)
  PARSE_TYPE(type_id, value::quatd)
  PARSE_TYPE(type_id, value::color3f)
  PARSE_TYPE(type_id, value::color4f)
  PARSE_TYPE(type_id, value::color3d)
  PARSE_TYPE(type_id, value::color4d)
  PARSE_TYPE(type_id, value::vector3f)
  PARSE_TYPE(type_id, value::normal3f)
  PARSE_TYPE(type_id, value::point3f)
  PARSE_TYPE(type_id, value::texcoord2f)
  PARSE_TYPE(type_id, value::texcoord3f)
  PARSE_TYPE(type_id, value::matrix2f)
  PARSE_TYPE(type_id, value::matrix3f)
  PARSE_TYPE(type_id, value::matrix4f)
  PARSE_TYPE(type_id, value::matrix2d)
  PARSE_TYPE(type_id, value::matrix3d)
  PARSE_TYPE(type_id, value::matrix4d) {
    PUSH_ERROR_AND_RETURN(" : TODO: timeSamples type " + value::GetTypeName(type_id));
  }

#undef PARSE_TYPE

  (*result) = val;

  return true;
}